

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Expression_*> * __thiscall
wasm::IRBuilder::build(Result<wasm::Expression_*> *__return_storage_ptr__,IRBuilder *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  Block *pBVar5;
  ulong uVar6;
  string local_48 [39];
  allocator<char> local_21;
  
  pSVar1 = (this->scopeStack).
           super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->scopeStack).
           super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 == pSVar2) {
    pBVar5 = MixedArena::alloc<wasm::Block>(&((this->builder).wasm)->allocator);
    *(Block **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = pBVar5;
LAB_00cd89d3:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
             super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
             super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> + 0x20) = '\0';
  }
  else {
    if (((ulong)(((long)pSVar2 - (long)pSVar1) / 0xb0) < 2) &&
       (*(__index_type *)
         ((long)&pSVar2[-1].scope.
                 super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                 .
                 super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
         + 0x18) == '\0')) {
      ppEVar3 = pSVar2[-1].exprStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = (long)ppEVar3 -
              (long)pSVar2[-1].exprStack.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      if (uVar6 < 9) {
        if (uVar6 != 8) {
          __assert_fail("scopeStack.back().exprStack.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-ir-builder.cpp"
                        ,0xae,"Result<Expression *> wasm::IRBuilder::build()");
        }
        pEVar4 = ppEVar3[-1];
        std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::clear
                  (&this->scopeStack);
        std::
        _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::clear(&(this->labelDepths)._M_h);
        *(Expression **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Expression_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Expression_*,_wasm::Err> = pEVar4;
        goto LAB_00cd89d3;
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"unused expressions without block context",&local_21);
      std::__detail::__variant::_Variant_storage<false,wasm::Expression*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Expression*,wasm::Err> *)__return_storage_ptr__,
                 local_48);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_48,"unfinished block context",&local_21);
      std::__detail::__variant::_Variant_storage<false,wasm::Expression*,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Expression*,wasm::Err> *)__return_storage_ptr__,
                 local_48);
    }
    std::__cxx11::string::~string(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Expression*> IRBuilder::build() {
  if (scopeStack.empty()) {
    return builder.makeBlock();
  }
  if (scopeStack.size() > 1 || !scopeStack.back().isNone()) {
    return Err{"unfinished block context"};
  }
  if (scopeStack.back().exprStack.size() > 1) {
    return Err{"unused expressions without block context"};
  }
  assert(scopeStack.back().exprStack.size() == 1);
  auto* expr = scopeStack.back().exprStack.back();
  scopeStack.clear();
  labelDepths.clear();
  return expr;
}